

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3auxGrowStatArray(Fts3auxCursor *pCsr,int nSize)

{
  Fts3auxColstats *pFVar1;
  Fts3auxColstats *aNew;
  int nSize_local;
  Fts3auxCursor *pCsr_local;
  
  if (pCsr->nStat < nSize) {
    pFVar1 = (Fts3auxColstats *)sqlite3_realloc64(pCsr->aStat,(long)nSize << 4);
    if (pFVar1 == (Fts3auxColstats *)0x0) {
      return 7;
    }
    memset(pFVar1 + pCsr->nStat,0,(long)(nSize - pCsr->nStat) << 4);
    pCsr->aStat = pFVar1;
    pCsr->nStat = nSize;
  }
  return 0;
}

Assistant:

static int fts3auxGrowStatArray(Fts3auxCursor *pCsr, int nSize){
  if( nSize>pCsr->nStat ){
    struct Fts3auxColstats *aNew;
    aNew = (struct Fts3auxColstats *)sqlite3_realloc64(pCsr->aStat, 
        sizeof(struct Fts3auxColstats) * nSize
    );
    if( aNew==0 ) return SQLITE_NOMEM;
    memset(&aNew[pCsr->nStat], 0, 
        sizeof(struct Fts3auxColstats) * (nSize - pCsr->nStat)
    );
    pCsr->aStat = aNew;
    pCsr->nStat = nSize;
  }
  return SQLITE_OK;
}